

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O0

err_t btokVerify(void *buf,size_t count,octet *sig,octet *pubkey,size_t pubkey_len)

{
  err_t eVar1;
  size_t *count_00;
  char *oid;
  octet *hash_00;
  octet *der;
  ulong in_R8;
  void *state;
  octet *hash;
  void *stack;
  size_t oid_len;
  octet oid_der [16];
  bign_params params [1];
  err_t code;
  size_t in_stack_fffffffffffffe40;
  bign_params *in_stack_fffffffffffffe48;
  octet *pubkey_00;
  bign_params *in_stack_fffffffffffffe68;
  octet *in_stack_fffffffffffffe70;
  bign_params *in_stack_fffffffffffffe78;
  octet *in_stack_fffffffffffffea0;
  octet *in_stack_fffffffffffffea8;
  octet *in_stack_fffffffffffffeb0;
  octet *in_stack_fffffffffffffeb8;
  octet *in_stack_fffffffffffffec0;
  bign_params *in_stack_fffffffffffffec8;
  bign_params *in_stack_fffffffffffffed0;
  err_t local_34;
  err_t local_4;
  
  pubkey_00 = &DAT_00000010;
  if ((in_R8 & 1) == 0) {
    btokParamsStd(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    count_00 = (size_t *)(in_R8 >> 1);
    if (in_R8 < 0x41) {
      oid = (char *)beltHash_keep();
    }
    else {
      oid = (char *)bashHash_keep();
    }
    hash_00 = (octet *)blobCreate((size_t)oid);
    if (hash_00 == (octet *)0x0) {
      local_4 = 0x6e;
    }
    else {
      der = hash_00 + (in_R8 >> 1);
      if (in_R8 < 0x41) {
        beltHashStart(count_00);
        beltHashStepH(hash_00,(size_t)der,count_00);
        beltHashStepG2(hash_00,(size_t)der,count_00);
        eVar1 = bignOidToDER(der,count_00,oid);
        if (eVar1 != 0) {
          blobClose((blob_t)0x152e17);
          return eVar1;
        }
      }
      else {
        bashHashStart(count_00,(size_t)oid);
        bashHashStepH(hash_00,(size_t)der,count_00);
        bashHashStepG(hash_00,(size_t)der,count_00);
        eVar1 = bignOidToDER(der,count_00,oid);
        if (eVar1 != 0) {
          blobClose((blob_t)0x152ec0);
          return eVar1;
        }
      }
      if (in_R8 == 0x30) {
        local_34 = bign96PubkeyVal(in_stack_fffffffffffffe68,pubkey_00);
      }
      else {
        local_34 = bignPubkeyVal(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      }
      if (local_34 == 0) {
        if (in_R8 == 0x30) {
          local_34 = bign96Verify(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                  (size_t)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                                  in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
        }
        else {
          local_34 = bignVerify(in_stack_fffffffffffffed0,(octet *)in_stack_fffffffffffffec8,
                                (size_t)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                                in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        }
        blobClose((blob_t)0x152fb2);
        local_4 = local_34;
      }
      else {
        blobClose((blob_t)0x152f28);
        local_4 = local_34;
      }
    }
  }
  else {
    local_4 = 0x6d;
  }
  return local_4;
}

Assistant:

static err_t btokVerify(const void* buf, size_t count, const octet sig[],
	const octet pubkey[], size_t pubkey_len)
{
	err_t code;
	bign_params params[1];
	octet oid_der[16];
	size_t oid_len = sizeof(oid_der);
	void* stack;
	octet* hash;
	void* state;
	// входной контроль
	if (pubkey_len % 2)
		return ERR_BAD_INPUT;
	// загрузить параметры
	code = btokParamsStd(params, pubkey_len / 2);
	// создать и разметить стек
	stack = blobCreate(pubkey_len / 2 +
		(pubkey_len <= 64 ? beltHash_keep() : bashHash_keep()));
	if (!stack)
		return ERR_OUTOFMEMORY;
	hash = (octet*)stack;
	state = hash + pubkey_len / 2;
   	// хэшировать
	if (pubkey_len <= 64)
	{
		beltHashStart(state);
		beltHashStepH(buf, count, state);
		beltHashStepG2(hash, pubkey_len / 2, state);
		code = bignOidToDER(oid_der, &oid_len, "1.2.112.0.2.0.34.101.31.81");
		ERR_CALL_HANDLE(code, blobClose(state));
		ASSERT(oid_len == 11);
	}
	else
	{
		bashHashStart(state, pubkey_len * 2);
		bashHashStepH(buf, count, state);
		bashHashStepG(hash, pubkey_len / 2, state);
		code = bignOidToDER(oid_der, &oid_len, pubkey_len == 96 ? 
			"1.2.112.0.2.0.34.101.77.12" : "1.2.112.0.2.0.34.101.77.13");
		ERR_CALL_HANDLE(code, blobClose(state));
		ASSERT(oid_len == 11);
	}
	// проверить открытый ключ
	if (pubkey_len == 48)
		code = bign96PubkeyVal(params, pubkey);
	else
		code = bignPubkeyVal(params, pubkey);
	ERR_CALL_HANDLE(code, blobClose(stack));
	// проверить подпись
	if (pubkey_len == 48)
		code = bign96Verify(params, oid_der, oid_len, hash, sig, pubkey);
	else
		code = bignVerify(params, oid_der, oid_len, hash, sig, pubkey);
	// завершить
	blobClose(stack);
	return code;
}